

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.h
# Opt level: O2

void __thiscall
google::protobuf::strings::UncheckedArrayByteSink::~UncheckedArrayByteSink
          (UncheckedArrayByteSink *this)

{
  operator_delete(this);
  return;
}

Assistant:

class PROTOBUF_EXPORT UncheckedArrayByteSink : public ByteSink {
 public:
  explicit UncheckedArrayByteSink(char* dest) : dest_(dest) {}
  virtual void Append(const char* data, size_t n) override;

  // Returns the current output pointer so that a caller can see how many bytes
  // were produced.
  //
  // Note: this method is not part of the ByteSink interface.
  char* CurrentDestination() const { return dest_; }

 private:
  char* dest_;
  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS(UncheckedArrayByteSink);
}